

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O0

leaf_type_help * __thiscall
tcmalloc::FixedAllocator<tcmalloc::PageMap::leaf_type_help>::Alloc
          (FixedAllocator<tcmalloc::PageMap::leaf_type_help> *this)

{
  FixedAllocator<tcmalloc::PageMap::leaf_type_help> *this_local;
  
  if ((this->inited & 1U) == 0) {
    if ((this->construct & 1U) == 0) {
      __assert_fail("construct",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/fixed_allocator.hpp"
                    ,0x18,
                    "T *tcmalloc::FixedAllocator<tcmalloc::PageMap::leaf_type_help>::Alloc() [T = tcmalloc::PageMap::leaf_type_help]"
                   );
    }
    Init(this);
  }
  if (this->freelist_ == (void *)0x0) {
    this_local = (FixedAllocator<tcmalloc::PageMap::leaf_type_help> *)AllocFromArea(this);
  }
  else {
    this_local = (FixedAllocator<tcmalloc::PageMap::leaf_type_help> *)AllocFromFreeList(this);
  }
  return (leaf_type_help *)this_local;
}

Assistant:

T *Alloc() {
        if (!inited) {
            assert(construct);
            Init();
        }
        if (freelist_ != nullptr) {
            return AllocFromFreeList();
        }
        return AllocFromArea();
    }